

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elem_alg.c
# Opt level: O1

void pnga_step_max_patch(Integer g_a,Integer *alo,Integer *ahi,Integer g_b,Integer *blo,Integer *bhi
                        ,void *result)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  logical lVar4;
  Integer IVar5;
  double *pdVar6;
  undefined8 uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  char *pcVar13;
  long lVar14;
  long lVar15;
  uint uVar16;
  long lVar17;
  bool bVar18;
  ulong uVar19;
  char *A_ptr;
  long local_648;
  Integer local_640;
  char *local_638;
  Integer g_c;
  Integer andim;
  Integer atype;
  Integer andim_1;
  Integer bndim;
  int local_604;
  float fresult;
  int iresult;
  long local_5f8;
  Integer atype_1;
  double *local_5e8;
  undefined8 local_5e0;
  long lresult;
  double dresult;
  Integer loA [7];
  Integer hiA [7];
  Integer compatible;
  Integer btype;
  Integer ldA [7];
  long lStack_4f0;
  undefined1 local_4e8 [48];
  Integer local_4b8;
  long local_4b0;
  long alStack_4a8 [6];
  Integer bunit [7];
  long alStack_440 [9];
  Integer bdims [7];
  Integer adims [7];
  Integer adims_1 [7];
  Integer index [7];
  
  iVar2 = _ga_sync_end;
  bVar18 = _ga_sync_begin != 0;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (bVar18) {
    pnga_sync();
  }
  pnga_check_handle(g_a,"ga_step_max_patch_");
  pnga_check_handle(g_b,"ga_step_max_patch_");
  pnga_inquire(g_a,&atype,&andim,adims);
  pnga_inquire(g_b,&btype,&bndim,bdims);
  if (atype != btype) {
    pnga_error(" ga_step_max_patch_: types mismatch ",0);
  }
  if (0 < andim) {
    lVar11 = 0;
    do {
      if ((alo[lVar11] < 1) || (adims[lVar11] < ahi[lVar11])) {
        pnga_error("g_a indices out of range ",g_a);
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < andim);
  }
  if (0 < bndim) {
    lVar11 = 0;
    do {
      if ((blo[lVar11] < 1) || (bdims[lVar11] < bhi[lVar11])) {
        pnga_error("g_b indices out of range ",g_b);
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < bndim);
  }
  lVar11 = 1;
  lVar9 = 1;
  if (0 < andim) {
    lVar12 = 0;
    do {
      lVar9 = lVar9 * ((ahi[lVar12] - alo[lVar12]) + 1);
      lVar12 = lVar12 + 1;
    } while (andim != lVar12);
  }
  if (0 < bndim) {
    lVar11 = 1;
    lVar12 = 0;
    do {
      lVar11 = lVar11 * ((bhi[lVar12] - blo[lVar12]) + 1);
      lVar12 = lVar12 + 1;
    } while (bndim != lVar12);
  }
  if (lVar11 != lVar9) {
    pnga_error(" ga_step_max_patch_ capacities of patches do not match ",0);
  }
  lVar4 = pnga_comp_patch(andim,alo,ahi,bndim,blo,bhi);
  compatible = (Integer)(lVar4 != 0);
  IVar5 = pnga_type_f2c(0x3f2);
  pnga_gop(IVar5,&compatible,1,"&&");
  if (compatible == 0) {
    pnga_error(" ga_step_max_patch_ mismatched patchs ",0);
  }
  switch(atype) {
  case 0x3e9:
    pdVar6 = (double *)&iresult;
    break;
  case 0x3ea:
    pdVar6 = (double *)&lresult;
    break;
  case 0x3eb:
    pdVar6 = (double *)&fresult;
    break;
  case 0x3ec:
    pdVar6 = &dresult;
    break;
  default:
    pcVar13 = "Ga_step_max_patch_: wrong data type.";
    goto LAB_00123e60;
  case 0x3ee:
  case 0x3ef:
    pcVar13 = "Ga_step_max_patch_: unavalable for complex datatype.";
LAB_00123e60:
    pnga_error(pcVar13,atype);
    pdVar6 = (double *)0x0;
  }
  if (g_a != g_b) {
    local_5e8 = pdVar6;
    IVar5 = has_negative_elem(g_a,alo,ahi);
    if (IVar5 == 1) {
      pnga_error("ga_step_max_patch_: g_a has negative element.",-1);
    }
    pnga_duplicate(g_a,&g_c,"Temp");
    if (g_c == 0) {
      pnga_error("ga_step_max_patch_:fail to duplicate array c",g_a);
    }
    ngai_elem2_patch_(g_a,alo,ahi,g_b,blo,bhi,g_c,alo,ahi,9);
    IVar5 = g_c;
    pnga_nodeid();
    bVar18 = _ga_sync_begin != 0;
    local_604 = _ga_sync_end;
    _ga_sync_begin = 1;
    _ga_sync_end = 1;
    if (bVar18) {
      pnga_sync();
    }
    pnga_check_handle(IVar5,"gai_elem3_patch_");
    pnga_inquire(IVar5,&atype_1,&andim_1,adims_1);
    pnga_total_blocks(IVar5);
    if (0 < andim_1) {
      lVar11 = 0;
      do {
        if ((alo[lVar11] < 1) || (adims_1[lVar11] < ahi[lVar11])) {
          pnga_error("g_a indices out of range ",IVar5);
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 < andim_1);
    }
    pnga_local_iterator_init(IVar5,(_iterator_hdl *)index);
    iVar3 = pnga_local_iterator_next((_iterator_hdl *)index,loA,hiA,&A_ptr,ldA);
    if (iVar3 != 0) {
      local_5e0 = 0x8000000000000001;
      do {
        IVar5 = andim_1;
        if (0 < andim_1) {
          memcpy(alStack_440 + 1,loA,andim_1 * 8);
        }
        lVar4 = pnga_patch_intersect(alo,ahi,loA,hiA,IVar5);
        if (lVar4 != 0) {
          if (0 < andim_1) {
            lVar11 = 0;
LAB_0012409b:
            if (loA[lVar11] <= alStack_440[lVar11 + 1]) goto code_r0x001240ad;
            if (andim_1 == 1) {
              lVar11 = 1;
              lVar9 = 0;
            }
            else {
              lVar11 = 1;
              lVar12 = 0;
              lVar9 = 0;
              do {
                lVar9 = lVar9 + (loA[lVar12] - alStack_440[lVar12 + 1]) * lVar11;
                lVar11 = lVar11 * ldA[lVar12];
                lVar12 = lVar12 + 1;
              } while (andim_1 + -1 != lVar12);
            }
            if (atype_1 - 0x3e9U < 7) {
              lVar9 = (loA[andim_1 + -1] - alStack_440[andim_1]) * lVar11 + lVar9;
              switch(atype_1) {
              case 0x3e9:
              case 0x3eb:
                lVar9 = lVar9 * 4;
                break;
              default:
                lVar9 = lVar9 * 8;
                break;
              case 0x3ed:
                goto switchD_00124139_caseD_3ed;
              case 0x3ef:
                lVar9 = lVar9 * 0x10;
              }
              A_ptr = A_ptr + lVar9;
            }
            else {
switchD_00124139_caseD_3ed:
              pnga_error(" wrong data type ",atype_1);
            }
          }
LAB_00124150:
          local_638 = A_ptr;
          lVar11 = 1;
          if (1 < andim_1) {
            lVar9 = 1;
            do {
              lVar11 = lVar11 * ((hiA[lVar9] - loA[lVar9]) + 1);
              lVar9 = lVar9 + 1;
            } while (andim_1 != lVar9);
          }
          lStack_4f0 = 0;
          bunit[0] = 1;
          bunit[1] = 1;
          local_4b8 = ldA[0];
          local_4b0 = ldA[0] * ldA[1];
          local_640 = atype_1;
          local_648 = andim_1;
          if (2 < andim_1) {
            memset(local_4e8,0,andim_1 * 8 - 0x10);
            lVar12 = 2;
            lVar9 = local_4b0;
            IVar5 = bunit[1];
            do {
              IVar5 = IVar5 * ((hiA[lVar12 + -1] - loA[lVar12 + -1]) + 1);
              lVar9 = lVar9 * ldA[lVar12];
              bunit[lVar12] = IVar5;
              (&local_4b8)[lVar12] = lVar9;
              lVar12 = lVar12 + 1;
            } while (local_648 != lVar12);
          }
          if (0 < lVar11) {
            local_5f8 = (long)(int)local_640;
            lVar9 = local_648 + -1;
            pcVar13 = (char *)0x0;
            lVar17 = 0;
            IVar5 = local_640;
            lVar12 = local_648;
            do {
              if (lVar12 < 2) {
                lVar15 = 0;
              }
              else {
                lVar14 = 0;
                lVar15 = 0;
                do {
                  lVar10 = *(long *)(local_4e8 + lVar14 * 8 + -8);
                  if ((lVar17 + 1) % bunit[lVar14 + 1] == 0) {
                    *(long *)(local_4e8 + lVar14 * 8 + -8) = lVar10 + 1;
                  }
                  lVar15 = lVar15 + lVar10 * (&local_4b8)[lVar14];
                  lVar10 = 0;
                  if (*(long *)(local_4e8 + lVar14 * 8 + -8) <= hiA[lVar14 + 1] - loA[lVar14 + 1]) {
                    lVar10 = *(long *)(local_4e8 + lVar14 * 8 + -8);
                  }
                  *(long *)(local_4e8 + lVar14 * 8 + -8) = lVar10;
                  lVar14 = lVar14 + 1;
                } while (lVar9 != lVar14);
              }
              switch(IVar5) {
              case 0x3e9:
              case 0x3eb:
                pcVar13 = local_638 + lVar15 * 4;
                break;
              case 0x3ea:
              case 0x3ec:
                pcVar13 = local_638 + lVar15 * 8;
                break;
              default:
                pnga_error(" ngai_elem3_patch_: wrong data type ",IVar5);
                IVar5 = local_640;
                lVar12 = local_648;
              }
              if ((int)IVar5 - 0x3e9U < 7) {
                uVar16 = (int)hiA[0] - (int)loA[0];
                uVar19 = (ulong)(uVar16 + 1);
                switch((int)IVar5) {
                case 0x3e9:
                  if (uVar16 < 0x7fffffff) {
                    uVar8 = 0;
                    do {
                      if (0 < *(int *)(pcVar13 + uVar8 * 4)) {
                        pcVar1 = pcVar13 + uVar8 * 4;
                        pcVar1[0] = '\x01';
                        pcVar1[1] = '\0';
                        pcVar1[2] = '\0';
                        pcVar1[3] = -0x80;
                      }
                      uVar8 = uVar8 + 1;
                    } while (uVar19 != uVar8);
                  }
                  break;
                case 0x3ea:
                  if (uVar16 < 0x7fffffff) {
                    uVar8 = 0;
                    do {
                      if (0 < *(long *)(pcVar13 + uVar8 * 8)) {
                        *(undefined8 *)(pcVar13 + uVar8 * 8) = local_5e0;
                      }
                      uVar8 = uVar8 + 1;
                    } while (uVar19 != uVar8);
                  }
                  break;
                case 0x3ec:
                  if (uVar16 < 0x7fffffff) {
                    uVar8 = 0;
                    do {
                      if (0.0 < *(double *)(pcVar13 + uVar8 * 8)) {
                        pcVar1 = pcVar13 + uVar8 * 8;
                        pcVar1[0] = '3';
                        pcVar1[1] = 't';
                        pcVar1[2] = -0x54;
                        pcVar1[3] = '<';
                        pcVar1[4] = '\x1f';
                        pcVar1[5] = '{';
                        pcVar1[6] = -0x54;
                        pcVar1[7] = -1;
                      }
                      uVar8 = uVar8 + 1;
                    } while (uVar19 != uVar8);
                  }
                  break;
                case 0x3ed:
                  goto switchD_0012436f_caseD_3ed;
                default:
                  pnga_error("do_stepmax:wrong data type",local_5f8);
                  IVar5 = local_640;
                  lVar12 = local_648;
                case 0x3eb:
                  if (uVar16 < 0x7fffffff) {
                    uVar8 = 0;
                    do {
                      if (0.0 < *(float *)(pcVar13 + uVar8 * 4)) {
                        pcVar1 = pcVar13 + uVar8 * 4;
                        pcVar1[0] = -0x3e;
                        pcVar1[1] = -0x43;
                        pcVar1[2] = -0x10;
                        pcVar1[3] = -4;
                      }
                      uVar8 = uVar8 + 1;
                    } while (uVar19 != uVar8);
                  }
                }
              }
              else {
switchD_0012436f_caseD_3ed:
                pnga_error("do_stepmax:wrong data type",local_5f8);
                IVar5 = local_640;
                lVar12 = local_648;
              }
              lVar17 = lVar17 + 1;
            } while (lVar17 != lVar11);
          }
        }
        iVar3 = pnga_local_iterator_next((_iterator_hdl *)index,loA,hiA,&A_ptr,ldA);
      } while (iVar3 != 0);
    }
    if (local_604 != 0) {
      pnga_sync();
    }
    pnga_select_elem(g_c,"max",local_5e8,index);
    switch(atype) {
    case 0x3e9:
      iVar3 = -iresult;
      if (0 < iresult) {
        iVar3 = iresult;
      }
      *(int *)result = iVar3;
      break;
    case 0x3ea:
      lVar11 = -lresult;
      if (0 < lresult) {
        lVar11 = lresult;
      }
      *(long *)result = lVar11;
      break;
    case 0x3eb:
      uVar16 = -(uint)(-fresult <= fresult);
      *(uint *)result = ~uVar16 & (uint)-fresult | (uint)fresult & uVar16;
      break;
    case 0x3ec:
      uVar19 = -(ulong)(-dresult <= dresult);
      *(ulong *)result = ~uVar19 & (ulong)-dresult | (ulong)dresult & uVar19;
      break;
    default:
      pcVar13 = "Ga_step_max_patch_: wrong data type.";
      goto LAB_001245ca;
    case 0x3ee:
    case 0x3ef:
      pcVar13 = "Ga_step_max_patch_: unavailable for complex datatype.";
LAB_001245ca:
      pnga_error(pcVar13,atype);
    }
    pnga_destroy(g_c);
    goto LAB_00124624;
  }
  switch(atype) {
  case 0x3e9:
    *(undefined4 *)result = 0x7fffffff;
    goto LAB_00124624;
  case 0x3ea:
    uVar7 = 0x7fffffffffffffff;
    break;
  case 0x3eb:
    *(undefined4 *)result = 0x7cf0bdc2;
    goto LAB_00124624;
  case 0x3ec:
    uVar7 = 0x7fac7b1f3cac7433;
    break;
  default:
    pcVar13 = "Ga_step_max_patch_: wrong data type.";
    goto LAB_001245bc;
  case 0x3ee:
  case 0x3ef:
    pcVar13 = "Ga_step_max_patch_: unavailable for complex datatype.";
LAB_001245bc:
    pnga_error(pcVar13,atype);
    goto LAB_00124624;
  }
  *(undefined8 *)result = uVar7;
LAB_00124624:
  if (iVar2 != 0) {
    pnga_sync();
  }
  return;
code_r0x001240ad:
  lVar11 = lVar11 + 1;
  if (andim_1 == lVar11) goto LAB_00124150;
  goto LAB_0012409b;
}

Assistant:

void pnga_step_max_patch(g_a,  alo, ahi, g_b,  blo, bhi, result) 
     Integer g_a, *alo, *ahi;    /* patch of g_a */
     Integer g_b, *blo, *bhi;    /* patch of g_b */
     void *result;
#if 0
     Integer op; /* operations */
#endif

{
  double  dresult;
  long    lresult;
  Integer atype;
  Integer andim, adims[MAXDIM];
  Integer btype;
  Integer bndim, bdims[MAXDIM];
  Integer index[MAXDIM];
  /* Integer num_blocks_a, num_blocks_b; */
  /* double result = -1; */
  Integer g_c;
  int iresult;
  Integer atotal,btotal;
  float   fresult;
  int local_sync_begin,local_sync_end;
  int i;
  Integer compatible;
  void *sresult = NULL;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if(local_sync_begin)pnga_sync();

  /* Check for valid ga handles. */

  pnga_check_handle(g_a, "ga_step_max_patch_");
  pnga_check_handle(g_b, "ga_step_max_patch_");


  /* get chacteristics of the input ga patches */

  pnga_inquire(g_a, &atype, &andim, adims);
  pnga_inquire(g_b, &btype, &bndim, bdims);
  /* num_blocks_a = pnga_total_blocks(g_a); */
  /* num_blocks_b = pnga_total_blocks(g_b); */

  /* Check for matching types. */
  if(atype != btype) pnga_error(" ga_step_max_patch_: types mismatch ", 0L); 

  /* check if patch indices and dims match */
  for(i=0; i<andim; i++)
    if(alo[i] <= 0 || ahi[i] > adims[i])
      pnga_error("g_a indices out of range ", g_a);
  for(i=0; i<bndim; i++)
    if(blo[i] <= 0 || bhi[i] > bdims[i])
      pnga_error("g_b indices out of range ", g_b);

  /* check if numbers of elements in patches match each other */
  atotal = 1; for(i=0; i<andim; i++) atotal *= (ahi[i] - alo[i] + 1);
  btotal = 1; for(i=0; i<bndim; i++) btotal *= (bhi[i] - blo[i] + 1);

  if(btotal != atotal)
    pnga_error(" ga_step_max_patch_ capacities of patches do not match ", 0L);

  /* test if patches match */
  if(pnga_comp_patch(andim, alo, ahi, bndim, blo, bhi)) compatible = 1;
  else compatible = 0;
  /* pnga_gop(pnga_type_f2c(MT_F_INT), &compatible, 1, "*"); */
  pnga_gop(pnga_type_f2c(MT_F_INT), &compatible, 1, "&&");
  if(!compatible) {
    pnga_error(" ga_step_max_patch_ mismatched patchs ",0);
  }

  switch (atype)
  {
    case C_INT:
      sresult = &iresult;
      break;
    case C_DCPL:
    case C_SCPL:
      pnga_error("Ga_step_max_patch_: unavalable for complex datatype.", 
          atype);
      break;
    case C_DBL:
      sresult = &dresult;
      break;
    case C_FLOAT:
      sresult = &fresult;
      break;
    case C_LONG:
      sresult = &lresult;
      break;
    default:
      pnga_error("Ga_step_max_patch_: wrong data type.", atype);
  }

  if(g_a == g_b) {
    /* It used to say 1, but if ga and gb are the same, and 
       ga is nonnegative then any number of multiples of gb
       can be added to ga still leaving it nonnegative.
     *result = (double)1.0;
     */
    switch (atype)
    {
      case C_INT:
        *(int*)result = GA_INFINITY_I;
        break;
      case C_DCPL:
      case C_SCPL:
        pnga_error("Ga_step_max_patch_: unavailable for complex datatype.", 
            atype);
        break;
      case C_DBL:
        *(double*)result = GA_INFINITY_D;
        break;
      case C_FLOAT:
        *(float*)result = GA_INFINITY_F;
        break;
      case C_LONG:
        *(long*)result = GA_INFINITY_L;
        break;
      default:
        pnga_error("Ga_step_max_patch_: wrong data type.", atype);
    }
  } else {
    /*Now look at each element of the array g_a. 
      If an element of g_a is negative, then simply return */ 
    if(has_negative_elem(g_a, alo, ahi) == 1)
      pnga_error("ga_step_max_patch_: g_a has negative element.", -1);

    /*duplicate an array c to hold the temparate result = g_a/g_b; */
    pnga_duplicate(g_a, &g_c, "Temp");
    if(g_c==0)
      pnga_error("ga_step_max_patch_:fail to duplicate array c", g_a);

    /*
       pnga_elem_divide_patch(g_a, alo, ahi, g_b, blo, bhi, g_c, alo, ahi);
     */
    pnga_elem_step_divide_patch(g_a, alo, ahi, g_b, blo, bhi, 
        g_c, alo, ahi);

    /*Now look at each element of the array g_c. If an element of g_c is positive,
      then replace it with -GA_INFINITY */ 
    ngai_elem3_patch_(g_c, alo, ahi, OP_STEPMAX);  
    /*Then, we will select the maximum of the array g_c*/ 
    pnga_select_elem(g_c, "max", sresult, index); 
    switch (atype)
    {
      case C_INT:
        *(int*)result = GA_ABS(iresult);
        break;
      case C_DCPL:
      case C_SCPL:
        pnga_error("Ga_step_max_patch_: unavailable for complex datatype.", 
            atype);
        break;
      case C_DBL:
        *(double*)result = GA_ABS(dresult);
        break;
      case C_FLOAT:
        *(float*)result = GA_ABS(fresult);
        break;
      case C_LONG:
        *(long*)result = GA_ABS(lresult);
        break;
      default:
        pnga_error("Ga_step_max_patch_: wrong data type.", atype);
    }
    pnga_destroy(g_c);
  }
  if(local_sync_end)pnga_sync();
}